

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O1

void __thiscall google::protobuf::io::Printer::CopyToBuffer(Printer *this,char *data,int size)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_t __n;
  void *void_buffer;
  char *local_30;
  
  if ((size != 0) && (this->failed_ == false)) {
    uVar2 = this->buffer_size_;
    if ((int)uVar2 < size) {
      do {
        if (0 < (int)uVar2) {
          memcpy(this->buffer_,data,(ulong)uVar2);
          iVar3 = this->buffer_size_;
          this->offset_ = this->offset_ + (long)iVar3;
          data = data + iVar3;
          size = size - iVar3;
        }
        iVar3 = (*this->output_->_vptr_ZeroCopyOutputStream[2])
                          (this->output_,&local_30,&this->buffer_size_);
        bVar1 = (bool)((byte)iVar3 ^ 1);
        this->failed_ = bVar1;
        if (bVar1 != false) {
          return;
        }
        this->buffer_ = local_30;
        uVar2 = this->buffer_size_;
      } while ((int)uVar2 < size);
    }
    __n = (size_t)size;
    memcpy(this->buffer_,data,__n);
    this->buffer_ = this->buffer_ + __n;
    this->buffer_size_ = this->buffer_size_ - size;
    this->offset_ = this->offset_ + __n;
  }
  return;
}

Assistant:

void Printer::CopyToBuffer(const char* data, int size) {
  if (failed_) return;
  if (size == 0) return;

  while (size > buffer_size_) {
    // Data exceeds space in the buffer.  Copy what we can and request a
    // new buffer.
    if (buffer_size_ > 0) {
      memcpy(buffer_, data, buffer_size_);
      offset_ += buffer_size_;
      data += buffer_size_;
      size -= buffer_size_;
    }
    void* void_buffer;
    failed_ = !output_->Next(&void_buffer, &buffer_size_);
    if (failed_) return;
    buffer_ = reinterpret_cast<char*>(void_buffer);
  }

  // Buffer is big enough to receive the data; copy it.
  memcpy(buffer_, data, size);
  buffer_ += size;
  buffer_size_ -= size;
  offset_ += size;
}